

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.h
# Opt level: O1

void __thiscall
MeCab::Allocator<mecab_node_t,_mecab_path_t>::~Allocator
          (Allocator<mecab_node_t,_mecab_path_t> *this)

{
  result_pair_type *prVar1;
  pointer pcVar2;
  NBestGenerator *pNVar3;
  ChunkFreeList<char> *pCVar4;
  FreeList<mecab_path_t> *pFVar5;
  FreeList<mecab_node_t> *pFVar6;
  
  this->_vptr_Allocator = (_func_int **)&PTR__Allocator_00172938;
  (this->results_)._vptr_scoped_array = (_func_int **)&PTR__scoped_array_00172a58;
  prVar1 = (this->results_).ptr_;
  if (prVar1 != (result_pair_type *)0x0) {
    operator_delete__(prVar1);
  }
  pcVar2 = (this->partial_buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2);
  }
  (this->nbest_generator_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_00172a28;
  pNVar3 = (this->nbest_generator_).ptr_;
  if (pNVar3 != (NBestGenerator *)0x0) {
    (*pNVar3->_vptr_NBestGenerator[1])();
  }
  (this->char_freelist_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_001729f8;
  pCVar4 = (this->char_freelist_).ptr_;
  if (pCVar4 != (ChunkFreeList<char> *)0x0) {
    (*pCVar4->_vptr_ChunkFreeList[1])();
  }
  (this->path_freelist_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_001729c8;
  pFVar5 = (this->path_freelist_).ptr_;
  if (pFVar5 != (FreeList<mecab_path_t> *)0x0) {
    (*pFVar5->_vptr_FreeList[1])();
  }
  (this->node_freelist_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_00172998;
  pFVar6 = (this->node_freelist_).ptr_;
  if (pFVar6 != (FreeList<mecab_node_t> *)0x0) {
    (*pFVar6->_vptr_FreeList[1])();
    return;
  }
  return;
}

Assistant:

virtual ~Allocator() {}